

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_opc(TCGContext_conflict9 *s,int opc,int r,int rm,int x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int rex;
  int x_local;
  int rm_local;
  int r_local;
  int opc_local;
  TCGContext_conflict9 *s_local;
  
  if ((opc & 0x8000U) != 0) {
    tcg_out8(s,'e');
  }
  if ((opc & 0x400U) != 0) {
    tcg_out8(s,'f');
  }
  if ((opc & 0x20000U) == 0) {
    if ((opc & 0x40000U) != 0) {
      tcg_out8(s,0xf2);
    }
  }
  else {
    tcg_out8(s,0xf3);
  }
  uVar1 = 0;
  if ((opc & 0x1000U) != 0) {
    uVar1 = 8;
  }
  uVar1 = (int)(rm & 8U) >> 3 | (int)(x & 8U) >> 2 | (int)(r & 8U) >> 1 | uVar1;
  uVar2 = 0;
  if (3 < r) {
    uVar2 = 0x2000;
  }
  uVar3 = 0;
  if (3 < rm) {
    uVar3 = 0x4000;
  }
  if ((opc & uVar3) != 0 || ((opc & uVar2) != 0 || uVar1 != 0)) {
    tcg_out8(s,(byte)uVar1 | 0x40);
  }
  if ((opc & 0x10300U) != 0) {
    tcg_out8(s,'\x0f');
    if ((opc & 0x200U) == 0) {
      if ((opc & 0x10000U) != 0) {
        tcg_out8(s,':');
      }
    }
    else {
      tcg_out8(s,'8');
    }
  }
  tcg_out8(s,(uint8_t)opc);
  return;
}

Assistant:

static void tcg_out_opc(TCGContext *s, int opc, int r, int rm, int x)
{
    int rex;

    if (opc & P_GS) {
        tcg_out8(s, 0x65);
    }
    if (opc & P_DATA16) {
        /* We should never be asking for both 16 and 64-bit operation.  */
        tcg_debug_assert((opc & P_REXW) == 0);
        tcg_out8(s, 0x66);
    }
    if (opc & P_SIMDF3) {
        tcg_out8(s, 0xf3);
    } else if (opc & P_SIMDF2) {
        tcg_out8(s, 0xf2);
    }

    rex = 0;
    rex |= (opc & P_REXW) ? 0x8 : 0x0;  /* REX.W */
    rex |= (r & 8) >> 1;                /* REX.R */
    rex |= (x & 8) >> 2;                /* REX.X */
    rex |= (rm & 8) >> 3;               /* REX.B */

    /* P_REXB_{R,RM} indicates that the given register is the low byte.
       For %[abcd]l we need no REX prefix, but for %{si,di,bp,sp}l we do,
       as otherwise the encoding indicates %[abcd]h.  Note that the values
       that are ORed in merely indicate that the REX byte must be present;
       those bits get discarded in output.  */
    rex |= opc & (r >= 4 ? P_REXB_R : 0);
    rex |= opc & (rm >= 4 ? P_REXB_RM : 0);

    if (rex) {
        tcg_out8(s, (uint8_t)(rex | 0x40));
    }

    if (opc & (P_EXT | P_EXT38 | P_EXT3A)) {
        tcg_out8(s, 0x0f);
        if (opc & P_EXT38) {
            tcg_out8(s, 0x38);
        } else if (opc & P_EXT3A) {
            tcg_out8(s, 0x3a);
        }
    }

    tcg_out8(s, opc);
}